

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcDimensionCurve::~IfcDimensionCurve(IfcDimensionCurve *this)

{
  void *pvVar1;
  char *pcVar2;
  long lVar3;
  void *pvVar4;
  
  lVar3 = *(long *)(*(long *)&(this->super_IfcAnnotationCurveOccurrence).
                              super_IfcAnnotationOccurrence.super_IfcStyledItem + -0x18);
  pvVar1 = &(this->super_IfcAnnotationCurveOccurrence).super_IfcAnnotationOccurrence.
            super_IfcStyledItem.field_0x0 + lVar3;
  pcVar2 = (this->super_IfcAnnotationCurveOccurrence).super_IfcAnnotationOccurrence.
           super_IfcStyledItem.Name.ptr.field_2._M_local_buf + lVar3;
  pcVar2[-0x58] = -8;
  pcVar2[-0x57] = ':';
  pcVar2[-0x56] = -0x66;
  pcVar2[-0x55] = '\0';
  pcVar2[-0x54] = '\0';
  pcVar2[-0x53] = '\0';
  pcVar2[-0x52] = '\0';
  pcVar2[-0x51] = '\0';
  pcVar2[0x48] = 'H';
  pcVar2[0x49] = ';';
  pcVar2[0x4a] = -0x66;
  pcVar2[0x4b] = '\0';
  pcVar2[0x4c] = '\0';
  pcVar2[0x4d] = '\0';
  pcVar2[0x4e] = '\0';
  pcVar2[0x4f] = '\0';
  pcVar2[-0x48] = ' ';
  pcVar2[-0x47] = ';';
  pcVar2[-0x46] = -0x66;
  pcVar2[-0x45] = '\0';
  pcVar2[-0x44] = '\0';
  pcVar2[-0x43] = '\0';
  pcVar2[-0x42] = '\0';
  pcVar2[-0x41] = '\0';
  if (*(char **)(pcVar2 + -0x10) != pcVar2) {
    operator_delete(*(char **)(pcVar2 + -0x10));
  }
  pvVar4 = *(void **)((long)pvVar1 + 0x30);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4);
  }
  operator_delete(pvVar1);
  return;
}

Assistant:

IfcDimensionCurve() : Object("IfcDimensionCurve") {}